

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrometracer.cpp
# Opt level: O1

void __thiscall
CChromeTracer::writeCallLogging
          (CChromeTracer *this,char *name,uint64_t threadId,uint64_t startTime,uint64_t delta,
          uint64_t id)

{
  char *__s;
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint64_t uVar4;
  
  __s = this->m_StringBuffer;
  auVar2._8_4_ = (int)(startTime >> 0x20);
  auVar2._0_8_ = startTime;
  auVar2._12_4_ = 0x45300000;
  uVar1 = SUB84(((auVar2._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)startTime) - 4503599627370496.0)) / 1000.0,0);
  auVar3._8_4_ = (int)(delta >> 0x20);
  auVar3._0_8_ = delta;
  auVar3._12_4_ = 0x45300000;
  uVar4 = id;
  snprintf(__s,0x4000,
           "{\"ph\":\"X\",\"pid\":%lu,\"tid\":%lu,\"name\":\"%s\",\"ts\":%.3f,\"dur\":%.3f,\"args\":{\"id\":%lu}},\n"
           ,uVar1,((auVar3._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)delta) - 4503599627370496.0)) / 1000.0,
           this->m_ProcessId,threadId,name,id);
  std::ostream::write((char *)&this->m_TraceFile,(long)__s);
  if (this->m_AddFlowEvents == true) {
    snprintf(__s,0x4000,
             "{\"ph\":\"s\",\"pid\":%lu,\"tid\":%lu,\"name\":\"Command\",\"cat\":\"Commands\",\"ts\":%.3f,\"id\":%lu},\n"
             ,uVar1,this->m_ProcessId,threadId,id,uVar4);
    std::ostream::write((char *)&this->m_TraceFile,(long)__s);
    return;
  }
  return;
}

Assistant:

void CChromeTracer::writeCallLogging(
    const char* name,
    uint64_t threadId,
    uint64_t startTime,
    uint64_t delta,
    uint64_t id )
{
    int size = CLI_SPRINTF(m_StringBuffer, CLI_STRING_BUFFER_SIZE,
        "{\"ph\":\"X\",\"pid\":%" PRIu64 ",\"tid\":%" PRIu64 ",\"name\":\"%s\""
        ",\"ts\":%.3f,\"dur\":%.3f,\"args\":{\"id\":%" PRIu64 "}},\n",
        m_ProcessId,
        threadId,
        name,
        startTime / 1000.0,
        delta / 1000.0,
        id );
    m_TraceFile.write(m_StringBuffer, size);

    if( m_AddFlowEvents )
    {
        int size = CLI_SPRINTF(m_StringBuffer, CLI_STRING_BUFFER_SIZE,
            "{\"ph\":\"s\",\"pid\":%" PRIu64 ",\"tid\":%" PRIu64 ",\"name\":\"Command\""
            ",\"cat\":\"Commands\",\"ts\":%.3f,\"id\":%" PRIu64 "},\n",
            m_ProcessId,
            threadId,
            startTime / 1000.0,
            id );
        m_TraceFile.write(m_StringBuffer, size);
    }
}